

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O2

void __thiscall
LPCMStreamReader::removeChannel
          (LPCMStreamReader *this,uint8_t *start,uint8_t *end,int cnNum,int mch)

{
  uint uVar1;
  int iVar2;
  uint8_t *curPos;
  uint8_t *__dest;
  
  if (mch == cnNum) {
    uVar1 = 3;
    if (this->m_bitsPerSample != 0x14) {
      uVar1 = (uint)(this->m_bitsPerSample >> 3);
    }
    iVar2 = mch * uVar1;
    __dest = start;
    for (; start < end; start = start + iVar2) {
      memmove(__dest,start,(long)iVar2);
      __dest = __dest + (int)(iVar2 - uVar1);
    }
    return;
  }
  __assert_fail("mch == cnNum",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/lpcmStreamReader.cpp"
                ,0xa4,
                "void LPCMStreamReader::removeChannel(uint8_t *, const uint8_t *, const int, const int) const"
               );
}

Assistant:

void LPCMStreamReader::removeChannel(uint8_t* start, const uint8_t* end, const int cnNum, const int mch) const
{
    // int mch = m_channels + (m_channels%2==1 ? 1 : 0);
    assert(mch == cnNum);
    const int ch1SampleSize = (m_bitsPerSample == 20 ? 3 : m_bitsPerSample / 8);
    const int fullSampleSize = mch * ch1SampleSize;
    uint8_t* dst = start;
    for (const uint8_t* curPos = start; curPos < end; curPos += fullSampleSize)
    {
        memmove(dst, curPos, fullSampleSize);
        dst += fullSampleSize - ch1SampleSize;
    }
}